

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall
GlobalSimpleStringMemoryAccountant::~GlobalSimpleStringMemoryAccountant
          (GlobalSimpleStringMemoryAccountant *this)

{
  long *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  GlobalSimpleStringMemoryAccountant *in_stack_ffffffffffffffe0;
  
  restoreAllocator(in_stack_ffffffffffffffe0);
  if (in_RDI[1] != 0) {
    MemoryAccountant::~MemoryAccountant((MemoryAccountant *)0x175388);
    operator_delete(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  if ((long *)*in_RDI != (long *)0x0) {
    (**(code **)(*(long *)*in_RDI + 8))();
  }
  return;
}

Assistant:

GlobalSimpleStringMemoryAccountant::~GlobalSimpleStringMemoryAccountant()
{
    restoreAllocator();

    delete accountant_;
    delete allocator_;
}